

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglframebufferobject.cpp
# Opt level: O1

void __thiscall
QOpenGLFramebufferObjectPrivate::initColorBuffer
          (QOpenGLFramebufferObjectPrivate *this,int idx,GLint *samples)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  QOpenGLContext *ctx;
  QOpenGLSharedResource *this_00;
  QOpenGLContextGroup *pQVar6;
  QOpenGLFramebufferObjectPrivate *this_01;
  int iVar7;
  long in_FS_OFFSET;
  GLuint color_buffer;
  undefined4 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ctx = (QOpenGLContext *)QOpenGLContext::currentContext();
  local_3c = 0;
  puVar1 = (undefined4 *)
           ((long)(this->colorAttachments).
                  super_QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>.
                  super_QVLABaseBase.ptr + (long)idx * 0x18);
  iVar7 = puVar1[2];
  cVar3 = QOpenGLContext::isOpenGLES();
  if (cVar3 != '\0') {
    if (puVar1[2] == 0x8052) {
      iVar7 = 0x8059;
    }
    else if (puVar1[2] == 0x1908) {
      bVar4 = QOpenGLExtensions::hasOpenGLExtension((int)this + StencilWrap);
      iVar7 = (uint)bVar4 * 2 + 0x8056;
    }
  }
  (**(code **)(*(long *)&this->funcs + 0x270))(1,&local_3c);
  (**(code **)(*(long *)&this->funcs + 0x1a0))(0x8d41,local_3c);
  (**(code **)(*(long *)&this->funcs + 0x540))(0x8d41,*samples,iVar7,*puVar1,puVar1[1]);
  this_01 = (QOpenGLFramebufferObjectPrivate *)0x8d40;
  (**(code **)(*(long *)&this->funcs + 0x248))(0x8d40,idx + 0x8ce0,0x8d41,local_3c);
  bVar5 = checkFramebufferStatus(this_01,ctx);
  this->field_0x34 = this->field_0x34 & 0xfe | bVar5;
  if (bVar5) {
    (**(code **)(*(long *)&this->funcs + 0x2b8))(0x8d41,0x8cab,samples);
    this_00 = (QOpenGLSharedResource *)operator_new(0x20);
    uVar2 = local_3c;
    pQVar6 = (QOpenGLContextGroup *)QOpenGLContext::shareGroup();
    QOpenGLSharedResource::QOpenGLSharedResource(this_00,pQVar6);
    *(code **)this_00 = bcmp;
    *(undefined4 *)(this_00 + 0x10) = uVar2;
    *(code **)(this_00 + 0x18) = anon_unknown.dwarf_8afdd::freeRenderbufferFunc;
    *(QOpenGLSharedResource **)(puVar1 + 4) = this_00;
  }
  else {
    (**(code **)(*(long *)&this->funcs + 0x220))(1,&local_3c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLFramebufferObjectPrivate::initColorBuffer(int idx, GLint *samples)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    GLuint color_buffer = 0;

    ColorAttachment &color(colorAttachments[idx]);

    GLenum storageFormat = color.internalFormat;
    // ES requires a sized format. The older desktop extension does not. Correct the format on ES.
    if (ctx->isOpenGLES()) {
        if (color.internalFormat == GL_RGBA) {
            if (funcs.hasOpenGLExtension(QOpenGLExtensions::Sized8Formats))
                storageFormat = GL_RGBA8;
            else
                storageFormat = GL_RGBA4;
        } else if (color.internalFormat == GL_RGB10) {
            // GL_RGB10 is not allowed in ES for glRenderbufferStorage.
            storageFormat = GL_RGB10_A2;
        }
    }

    funcs.glGenRenderbuffers(1, &color_buffer);
    funcs.glBindRenderbuffer(GL_RENDERBUFFER, color_buffer);
    funcs.glRenderbufferStorageMultisample(GL_RENDERBUFFER, *samples, storageFormat, color.size.width(), color.size.height());
    funcs.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + idx,
                                    GL_RENDERBUFFER, color_buffer);

    QT_CHECK_GLERROR();
    valid = checkFramebufferStatus(ctx);
    if (valid) {
        // Query the actual number of samples. This can be greater than the requested
        // value since the typically supported values are 0, 4, 8, ..., and the
        // requests are mapped to the next supported value.
        funcs.glGetRenderbufferParameteriv(GL_RENDERBUFFER, GL_RENDERBUFFER_SAMPLES, samples);
        color.guard = new QOpenGLSharedResourceGuard(ctx, color_buffer, freeRenderbufferFunc);
    } else {
        funcs.glDeleteRenderbuffers(1, &color_buffer);
    }
}